

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::Internal::
     Evaluator<bsim::static_quad_value_bit_vector<41>,_bsim::static_quad_value_bit_vector<41>,_(Catch::Internal::Operator)0>
     ::evaluate(static_quad_value_bit_vector<41> *lhs,static_quad_value_bit_vector<41> *rhs)

{
  uchar uVar1;
  uchar uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0;
  bVar4 = false;
  while( true ) {
    uVar1 = lhs->bits[uVar3].value;
    if (uVar1 == '\x03') {
      __assert_fail("!a.is_high_impedance()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/static_quad_value_bit_vector.h"
                    ,0x109,"bool bsim::operator!=(const quad_value &, const quad_value &)");
    }
    uVar2 = rhs->bits[uVar3].value;
    if (uVar2 == '\x03') {
      __assert_fail("!b.is_high_impedance()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/static_quad_value_bit_vector.h"
                    ,0x10a,"bool bsim::operator!=(const quad_value &, const quad_value &)");
    }
    if (uVar1 == '\x02') {
      return bVar4;
    }
    if (uVar1 != uVar2) break;
    bVar4 = 0x27 < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 0x29) {
      return bVar4;
    }
  }
  return bVar4;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }